

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpMap<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  TcParseTableBase *pTVar4;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  f;
  UntypedMapBase *pUVar5;
  ParseContext *pPVar6;
  uint64_t uVar7;
  ParseContext *p;
  MessageLite *x;
  TypeKind TVar8;
  unsigned_short uVar9;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  FieldEntry *entry_00;
  MapFieldBaseForParse *this;
  NodeBase *pNVar14;
  char *pcVar15;
  LogMessage *pLVar16;
  Arena *pAVar17;
  int *piVar18;
  long lVar19;
  uint7 uVar23;
  long lVar20;
  uint *puVar21;
  ulong uVar22;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  bool bVar24;
  UntypedMapBase *local_468;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_450;
  ParseContext *local_448;
  char *ptr2;
  uint32_t next_tag;
  TypeInfo local_42c;
  uint local_428;
  uint local_424;
  uint local_420;
  byte local_41c;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_418;
  char **local_410;
  TcParseTableBase **local_408;
  undefined1 *local_400;
  uint64_t *local_3f8;
  FieldEntry *local_3f0;
  UntypedMapBase *local_3e8;
  undefined1 *local_3d8;
  UntypedMapBase *local_3d0;
  UntypedMapBase *local_3c8;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  local_3c0;
  UntypedMapBase *local_3a0;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
  local_398;
  LogMessage local_390;
  Voidify local_379;
  unsigned_long local_378;
  long local_370;
  Nullable<const_char_*> local_368;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  void *node_key;
  long local_350;
  char *node_end;
  NodeBase *node;
  UntypedMapBase *pUStack_338;
  uint32_t saved_tag;
  UntypedMapBase *map;
  void *base;
  uint local_31d;
  byte local_319;
  FieldAux *pFStack_318;
  MapAuxInfo map_info;
  FieldAux *aux;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_2d0;
  TcFieldData local_2c8;
  undefined1 local_2b9;
  uint64_t uStack_2b8;
  bool always_return;
  TcParseTableBase *local_2b0;
  ParseContext *local_2a8;
  ParseContext *local_2a0;
  MessageLite *local_298;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_290;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_288;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_280;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  uint64_t res;
  ParseContext *local_178;
  ulong uStack_e8;
  int32_t sample;
  size_t pos;
  uint16_t num_ordered;
  uint16_t length_bitmap;
  uint64_t adjusted;
  uint16_t length_seq;
  int16_t min_seq;
  LimitToken local_b4;
  LogMessage local_b0;
  Voidify local_99;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  undefined4 local_88;
  int old_depth;
  LimitToken local_74;
  char ***pppcStack_70;
  LimitToken old;
  ParseContext *local_58;
  undefined1 local_40 [12];
  int size;
  ParseContext *local_30;
  TcParseTableBase *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  char ***local_10;
  
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar10 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  entry_00 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar10);
  pFStack_318 = TcParseTableBase::field_aux((TcParseTableBase *)hasbits_local,entry_00);
  local_31d = (pFStack_318->enum_range).first;
  local_319 = (byte)(pFStack_318->enum_range).last;
  bVar24 = true;
  if ((local_319 & 1) != 0) {
    uVar10 = TcFieldData::tag((TcFieldData *)&msg_local);
    bVar24 = (uVar10 & 7) != 2;
  }
  if (bVar24) {
    base = msg_local;
    pcVar15 = MpFallback((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                         (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,hasbits);
    return pcVar15;
  }
  map = (UntypedMapBase *)
        MaybeGetSplitBase((MessageLite *)ptr_local,false,(TcParseTableBase *)hasbits_local);
  if ((local_319 >> 1 & 1) == 0) {
    this = RefAt<google::protobuf::internal::MapFieldBaseForParse>(map,(ulong)entry_00->offset);
    local_468 = MapFieldBaseForParse::MutableMap(this);
  }
  else {
    local_468 = RefAt<google::protobuf::internal::UntypedMapBase>(map,(ulong)entry_00->offset);
  }
  pUStack_338 = local_468;
  node._4_4_ = TcFieldData::tag((TcFieldData *)&msg_local);
  do {
    pNVar14 = UntypedMapBase::AllocNode(pUStack_338);
    node_end = (char *)pNVar14;
    node_key._4_4_ = UntypedMapBase::type_info(pUStack_338);
    local_350 = (long)&pNVar14->next + (long)(int)((uint)node_key._4_4_ & 0xffff);
    absl_log_internal_check_op_result =
         (Nullable<const_char_*>)NodeBase::GetVoidKey((NodeBase *)node_end);
    local_370 = absl::lts_20250127::log_internal::GetReferenceableValue
                          (local_350 - (long)absl_log_internal_check_op_result);
    local_378 = absl::lts_20250127::log_internal::GetReferenceableValue(8);
    local_368 = absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                          (&local_370,&local_378,
                           "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    pUVar5 = pUStack_338;
    pcVar15 = node_end;
    if (local_368 != (Nullable<const_char_*>)0x0) {
      pcVar15 = absl::lts_20250127::implicit_cast<char_const*>(local_368);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_390,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0xb2c,pcVar15);
      pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_390);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_379,pLVar16);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_390);
    }
    absl_log_internal_check_op_result[0] = '\0';
    absl_log_internal_check_op_result[1] = '\0';
    absl_log_internal_check_op_result[2] = '\0';
    absl_log_internal_check_op_result[3] = '\0';
    absl_log_internal_check_op_result[4] = '\0';
    absl_log_internal_check_op_result[5] = '\0';
    absl_log_internal_check_op_result[6] = '\0';
    absl_log_internal_check_op_result[7] = '\0';
    *(undefined8 *)(local_350 + -8) = 0;
    local_3a0 = pUStack_338;
    absl::lts_20250127::
    Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2866:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2870:19)>
    ::Overload(&local_398,pUStack_338);
    UntypedMapBase::
    VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
              (pUVar5,(NodeBase *)pcVar15,local_398);
    pUVar5 = pUStack_338;
    pcVar15 = node_end;
    local_3c8 = pUStack_338;
    local_3d0 = pUStack_338;
    local_3d8 = (undefined1 *)&stack0xfffffffffffffce8;
    absl::lts_20250127::
    Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2875:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2878:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2882:19)>
    ::Overload(&local_3c0,pUStack_338,&stack0xfffffffffffffce8,pUStack_338);
    f.super_anon_class_16_2_4417ab01.aux = local_3c0.super_anon_class_16_2_4417ab01.aux;
    f.super_anon_class_8_1_ba1d60bc.map = local_3c0.super_anon_class_8_1_ba1d60bc.map;
    f.super_anon_class_16_2_4417ab01.map = local_3c0.super_anon_class_16_2_4417ab01.map;
    UntypedMapBase::
    VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>
              (pUVar5,(NodeBase *)pcVar15,f);
    pPVar6 = ctx_local;
    pTVar4 = table_local;
    local_410 = &node_end;
    local_408 = &table_local;
    local_3f8 = &hasbits_local;
    local_3e8 = pUStack_338;
    pppcStack_70 = &local_410;
    local_400 = (undefined1 *)&stack0xfffffffffffffce8;
    local_3f0 = entry_00;
    EpsCopyInputStream::LimitToken::LimitToken(&local_74);
    local_28 = pTVar4;
    local_30 = pPVar6;
    unique0x10000c65 = &local_74;
    local_40._4_4_ = ReadSize((char **)&local_30);
    if ((local_30 == (ParseContext *)0x0) || (*(int *)&pTVar4[1].class_data < 1)) {
      local_20 = (ParseContext *)0x0;
    }
    else {
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_40,(char *)pTVar4,(int)local_30);
      EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffffc8,(LimitToken *)local_40);
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_40);
      *(int *)&pTVar4[1].class_data = *(int *)&pTVar4[1].class_data + -1;
      local_20 = local_30;
    }
    if (local_20 == (ParseContext *)0x0) {
      local_58 = local_20;
    }
    else {
      absl_log_internal_check_op_result_1._4_4_ = *(int *)&pTVar4[1].class_data;
      local_10 = pppcStack_70;
      local_18 = local_20;
      local_58 = (ParseContext *)
                 ParseOneMapEntry((NodeBase *)**pppcStack_70,(char *)local_20,
                                  (ParseContext *)*pppcStack_70[1],(FieldAux *)*pppcStack_70[2],
                                  (TcParseTableBase *)*pppcStack_70[3],(FieldEntry *)pppcStack_70[4]
                                  ,(UntypedMapBase *)pppcStack_70[5]);
      if (local_58 != (ParseContext *)0x0) {
        iVar11 = absl::lts_20250127::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result_1._4_4_);
        iVar12 = absl::lts_20250127::log_internal::GetReferenceableValue
                           (*(int *)&pTVar4[1].class_data);
        local_98 = absl::lts_20250127::log_internal::Check_EQImpl
                             (iVar11,iVar12,"old_depth == depth_");
        if (local_98 != (Nullable<const_char_*>)0x0) {
          pcVar15 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x481,pcVar15);
          pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar16);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_b0);
        }
        local_98 = (Nullable<const_char_*>)0x0;
      }
      *(int *)&pTVar4[1].class_data = *(int *)&pTVar4[1].class_data + 1;
      EpsCopyInputStream::LimitToken::LimitToken(&local_b4,&local_74);
      bVar24 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)pTVar4,&local_b4);
      EpsCopyInputStream::LimitToken::~LimitToken(&local_b4);
      if (((bVar24 ^ 0xffU) & 1) != 0) {
        local_58 = (ParseContext *)0x0;
      }
    }
    local_88 = 1;
    EpsCopyInputStream::LimitToken::~LimitToken(&local_74);
    ctx_local = local_58;
    if (local_58 == (ParseContext *)0x0) {
      pAVar17 = UntypedMapBase::arena(pUStack_338);
      if (pAVar17 == (Arena *)0x0) {
        UntypedMapBase::DeleteNode(pUStack_338,(NodeBase *)node_end);
      }
      pcVar15 = ptr_local;
      pPVar6 = ctx_local;
      pTVar4 = table_local;
      TcFieldData::TcFieldData((TcFieldData *)&local_418);
      pcVar15 = Error((MessageLite *)pcVar15,(char *)pPVar6,(ParseContext *)pTVar4,
                      (TcFieldData)local_418,(TcParseTableBase *)hasbits_local,hasbits);
      return pcVar15;
    }
    bVar24 = false;
    if ((local_319 >> 4 & 1) != 0) {
      piVar18 = UntypedMapBase::GetValue<int>(pUStack_338,(NodeBase *)node_end);
      iVar11 = *piVar18;
      pTVar4 = pFStack_318[1].table;
      uVar2 = pTVar4->has_bits_offset;
      uVar3 = pTVar4->extension_offset;
      if ((ulong)((long)iVar11 - (long)(short)uVar2) < (ulong)(ushort)uVar3) {
        bVar24 = true;
      }
      else {
        uVar22 = ((long)iVar11 - (long)(short)uVar2) - (ulong)(ushort)uVar3;
        if (uVar22 < (ushort)pTVar4->max_field_number) {
          bVar24 = (*(uint *)(&pTVar4->fast_idx_mask + (uVar22 >> 5) * 4) >> ((byte)uVar22 & 0x1f) &
                   1) == 1;
        }
        else {
          for (uStack_e8 = 0; uStack_e8 < (ushort)(pTVar4->max_field_number >> 0x10);
              uStack_e8 = uStack_e8 * 2 + (long)iVar12) {
            if (*(int *)(&pTVar4->has_bits_offset +
                        (long)(int)((pTVar4->max_field_number & 0xffff) / 0x20 + 2) * 2 +
                        uStack_e8 * 2) == iVar11) {
              bVar24 = true;
              goto LAB_00390ed5;
            }
            iVar12 = 2;
            if (iVar11 < *(int *)(&pTVar4->has_bits_offset +
                                 (long)(int)((pTVar4->max_field_number & 0xffff) / 0x20 + 2) * 2 +
                                 uStack_e8 * 2)) {
              iVar12 = 1;
            }
          }
          bVar24 = false;
        }
      }
LAB_00390ed5:
      bVar24 = (bool)(bVar24 ^ 1);
    }
    if (bVar24) {
      local_41c = local_319;
      local_420 = local_31d;
      local_424 = CONCAT31(local_424._1_3_,local_319);
      local_428 = local_31d;
      WriteMapEntryAsUnknown
                ((MessageLite *)ptr_local,(TcParseTableBase *)hasbits_local,pUStack_338,node._4_4_,
                 (NodeBase *)node_end,(MapAuxInfo)((uint5)local_31d | (uint5)local_424 << 0x20));
    }
    else {
      local_42c = UntypedMapBase::type_info(pUStack_338);
      TVar8 = UntypedMapBase::TypeInfo::key_type_kind(&local_42c);
      switch(TVar8) {
      case kBool:
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)pUStack_338,(KeyNode *)node_end);
        break;
      case kU32:
        KeyMapBase<unsigned_int>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_int> *)pUStack_338,(KeyNode *)node_end);
        break;
      case kU64:
        KeyMapBase<unsigned_long>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_long> *)pUStack_338,(KeyNode *)node_end);
        break;
      default:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb68);
      case kString:
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pUStack_338,(KeyNode *)node_end);
      }
    }
    bVar24 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local);
    local_298 = (MessageLite *)ptr_local;
    pPVar6 = ctx_local;
    pTVar4 = table_local;
    if (((bVar24 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData((TcFieldData *)&next_tag);
      if (*(ushort *)hasbits_local != 0) {
        puVar21 = RefAt<unsigned_int>(local_298,(ulong)(uint)*(ushort *)hasbits_local);
        *puVar21 = (uint)hasbits | *puVar21;
      }
      return (char *)pPVar6;
    }
    ptr2._0_4_ = (uint)*(byte *)&(ctx_local->super_EpsCopyInputStream).limit_end_;
    if ((ulong)(long)(int)(uint)ptr2 < 0x80) {
      local_178 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
    }
    else {
      lVar20 = (long)(int)(uint)ptr2 << 0x39;
      uVar23 = (uint7)((ulong)lVar20 >> 8);
      bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
      lVar19 = CONCAT71(uVar23,bVar1);
      if ((bVar1 & 0x80) == 0) {
        ptr2._0_4_ = (int)lVar19 << 7 | (uint)((ulong)lVar20 >> 0x39);
        local_178 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
      }
      else {
        uVar23 = uVar23 >> 7 | (uint7)((ulong)(lVar19 << 0x39) >> 8);
        bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
        lVar20 = CONCAT71(uVar23,bVar1);
        if ((bVar1 & 0x80) == 0) {
          ptr2._0_4_ = (int)lVar20 << 0xe | (uint)(uVar23 >> 0x2a);
          local_178 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 3);
        }
        else {
          uVar23 = uVar23 >> 7 | (uint7)((ulong)(lVar20 << 0x39) >> 8);
          bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 3);
          lVar20 = CONCAT71(uVar23,bVar1);
          if ((bVar1 & 0x80) == 0) {
            ptr2._0_4_ = (int)lVar20 << 0x15 | (uint)(uVar23 >> 0x23);
            local_178 = (ParseContext *)
                        ((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
          }
          else {
            uVar23 = uVar23 >> 7 | (uint7)((ulong)(lVar20 << 0x39) >> 8);
            bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
            if ((bVar1 & 0x80) == 0) {
              ptr2._0_4_ = (int)CONCAT71(uVar23,bVar1) << 0x1c | (uint)(uVar23 >> 0x1c);
              local_178 = (ParseContext *)
                          ((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 5);
            }
            else {
              ptr2._0_4_ = 0;
              local_178 = (ParseContext *)0x0;
            }
          }
        }
      }
    }
    local_448 = local_178;
    if ((uint)ptr2 != node._4_4_) {
      TcFieldData::TcFieldData((TcFieldData *)&local_450);
      local_290 = local_450;
      local_2a0 = pPVar6;
      local_2a8 = (ParseContext *)pTVar4;
      local_2b0 = (TcParseTableBase *)hasbits_local;
      local_2b9 = 0;
      uStack_2b8 = hasbits;
      bVar24 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar4,(char *)pPVar6);
      x = local_298;
      p = local_2a0;
      pPVar6 = local_2a8;
      if (!bVar24) {
        TcFieldData::TcFieldData(&local_2c8);
        if (local_2b0->has_bits_offset != 0) {
          uVar13 = (uint)uStack_2b8;
          puVar21 = RefAt<unsigned_int>(x,(ulong)(uint)local_2b0->has_bits_offset);
          *puVar21 = uVar13 | *puVar21;
        }
        return (char *)p;
      }
      TcFieldData::TcFieldData(&local_2d0);
      pTVar4 = local_2b0;
      uVar7 = uStack_2b8;
      uVar9 = UnalignedLoad<unsigned_short>((char *)p);
      uVar22 = (ulong)(int)((uint)uVar9 & (uint)pTVar4->fast_idx_mask);
      if ((uVar22 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(pTVar4,uVar22 >> 3);
      local_280.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar9;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_288.data = local_280.data;
      pcVar15 = (*UNRECOVERED_JUMPTABLE)(x,(char *)p,pPVar6,(TcFieldData)local_280,pTVar4,uVar7);
      return pcVar15;
    }
    ctx_local = local_178;
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}